

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperVec.c
# Opt level: O1

void Map_NodeVecRemove(Map_NodeVec_t *p,Map_Node_t *Entry)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  iVar1 = p->nSize;
  uVar2 = (ulong)iVar1;
  bVar5 = 0 < (long)uVar2;
  if (0 < (long)uVar2) {
    if (*p->pArray == Entry) {
      uVar3 = 1;
      uVar4 = 0;
    }
    else {
      uVar3 = 1;
      do {
        uVar4 = uVar3;
        if (uVar2 == uVar4) goto LAB_00403fcf;
        uVar3 = uVar4 + 1;
      } while (p->pArray[uVar4] != Entry);
      bVar5 = uVar4 < uVar2;
    }
    if (bVar5) {
      if ((int)uVar4 + 1 < iVar1) {
        do {
          p->pArray[uVar4] = p->pArray[uVar3];
          uVar3 = uVar3 + 1;
          uVar4 = uVar4 + 1;
        } while (iVar1 - 1 != uVar4);
      }
      p->nSize = iVar1 + -1;
      return;
    }
  }
LAB_00403fcf:
  __assert_fail("i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperVec.c"
                ,0x100,"void Map_NodeVecRemove(Map_NodeVec_t *, Map_Node_t *)");
}

Assistant:

void Map_NodeVecRemove( Map_NodeVec_t * p, Map_Node_t * Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            break;
    assert( i < p->nSize );
    for ( i++; i < p->nSize; i++ )
        p->pArray[i-1] = p->pArray[i];
    p->nSize--;
}